

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootstrap.c
# Opt level: O1

void skipSpaces(void)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  
  while( true ) {
    iVar3 = inputPosition;
    pcVar4 = p + 2;
    while( true ) {
      bVar1 = *p;
      if ((0x20 < (ulong)bVar1) || ((0x100000600U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
      pcVar4 = pcVar4 + 1;
      p = p + 1;
    }
    inputPosition = inputPosition + 1;
    pcVar5 = p + 1;
    if (bVar1 != 0x22) {
      return;
    }
    while ((p = pcVar5, pcVar5 = pcVar4, cVar2 = pcVar5[-1], cVar2 != '\0' && (cVar2 != '\"'))) {
      pcVar4 = pcVar5 + 1;
    }
    inputPosition = iVar3 + 3;
    if (cVar2 != '\"') break;
    p = p + 1;
    inputPosition = iVar3 + 4;
  }
  parseError("unterminated comment");
}

Assistant:

void skipSpaces()
{
    while ((*p == ' ') || (*p == '\t') || (*p == '\n'))
        p++; inputPosition++;
    if (*p == '\"') {
        p++; inputPosition++;
        while (*p && (*p != '\"'))
            p++; inputPosition++;
        if (*p != '\"')
            parseError("unterminated comment");
        p++; inputPosition++;
        skipSpaces();
    }
}